

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

bool __thiscall llvm::detail::DoubleAPFloat::isDenormal(DoubleAPFloat *this)

{
  bool bVar1;
  bool bVar2;
  fltCategory fVar3;
  cmpResult cVar4;
  type pAVar5;
  type this_00;
  type RHS;
  bool local_49;
  bool local_3a;
  APFloat local_38;
  DoubleAPFloat *local_18;
  DoubleAPFloat *this_local;
  
  local_18 = this;
  fVar3 = getCategory(this);
  bVar1 = false;
  local_3a = false;
  if (fVar3 == fcNormal) {
    pAVar5 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&this->Floats,0);
    bVar2 = APFloat::isDenormal(pAVar5);
    local_49 = true;
    if (!bVar2) {
      pAVar5 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,1);
      bVar2 = APFloat::isDenormal(pAVar5);
      local_49 = true;
      if (!bVar2) {
        pAVar5 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                           (&this->Floats,0);
        this_00 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::
                  operator[](&this->Floats,0);
        RHS = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                        (&this->Floats,1);
        APFloat::operator+(&local_38,this_00,RHS);
        bVar1 = true;
        cVar4 = APFloat::compare(pAVar5,&local_38);
        local_49 = cVar4 != cmpEqual;
      }
    }
    local_3a = local_49;
  }
  this_local._7_1_ = local_3a;
  if (bVar1) {
    APFloat::~APFloat(&local_38);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DoubleAPFloat::isDenormal() const {
  return getCategory() == fcNormal &&
         (Floats[0].isDenormal() || Floats[1].isDenormal() ||
          // (double)(Hi + Lo) == Hi defines a normal number.
          Floats[0].compare(Floats[0] + Floats[1]) != cmpEqual);
}